

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# se.cpp
# Opt level: O3

void camera_fun(char *ip,int port,int device,int quality)

{
  int __fd;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buff;
  vector<int,_std::allocator<int>_> params;
  sockaddr_in addrRec;
  Mat frame;
  VideoCapture capture;
  Mat capframe;
  int local_18c;
  void *local_188;
  long lStack_180;
  undefined8 local_178;
  vector<int,_std::allocator<int>_> local_168;
  _InputArray local_148;
  sockaddr local_130;
  _InputArray local_120 [4];
  VideoCapture local_c0 [48];
  Mat local_90 [96];
  
  local_130.sa_family = 2;
  local_130.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
  local_18c = quality;
  local_130.sa_data._2_4_ = inet_addr(ip);
  __fd = socket(2,2,0);
  if (__fd < 0) {
    printf("%d create socket fail\n",(ulong)(uint)port);
    return;
  }
  cv::VideoCapture::VideoCapture(local_c0,device,0);
  cv::Mat::Mat(local_90);
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_120[0].flags = 1;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&local_168,(iterator)0x0,&local_120[0].flags);
  if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_168,
               (iterator)
               local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_18c);
  }
  else {
    *local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = quality;
    local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  do {
    cv::VideoCapture::operator>>(local_c0,local_90);
    local_188 = (void *)0x0;
    lStack_180 = 0;
    local_178 = 0;
    local_120[0]._0_8_ = (long)local_120 + 0x10U;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,".jpg","");
    local_148.sz.width = 0;
    local_148.sz.height = 0;
    local_148.flags = 0x1010000;
    local_148.obj = local_90;
    cv::imencode((string *)local_120,&local_148,(vector *)&local_188,(vector *)&local_168);
    if (local_120[0]._0_8_ != (long)local_120 + 0x10U) {
      operator_delete((void *)local_120[0]._0_8_);
    }
    local_148.sz.width = 0;
    local_148.sz.height = 0;
    local_148.flags = -0x7efd0000;
    local_148.obj = (vector *)&local_188;
    cv::imdecode(local_120,(int)&local_148);
    sendto(__fd,local_188,lStack_180 - (long)local_188,0,&local_130,0x10);
    cv::waitKey(10);
    cv::Mat::~Mat((Mat *)local_120);
    if (local_188 != (void *)0x0) {
      operator_delete(local_188);
    }
  } while( true );
}

Assistant:

void camera_fun(char ip[],int port ,int device,int quality){

	struct sockaddr_in addrRec;

	addrRec.sin_family = AF_INET;
	addrRec.sin_port = htons(port);//
	addrRec.sin_addr.s_addr = inet_addr(ip);//
	
	int sockClient = socket(AF_INET, SOCK_DGRAM, 0);

	if(sockClient < 0){
		printf("%d create socket fail\n",port);
		return ;
	}

	int nLen = sizeof(sockaddr_in);
 
	VideoCapture capture(device);
	Mat capframe;
	
	std::vector<int> params;
	params.push_back(IMWRITE_JPEG_QUALITY);
	params.push_back(quality);

	while (1)
	{
		capture >> capframe;
		std::vector<uchar> buff;
		imencode(".jpg", capframe, buff, params);
	
		Mat frame = imdecode(buff, -1);
		sendto(sockClient, (char *)&buff[0],buff.size() , 0, (struct sockaddr*)&addrRec, nLen);
		waitKey(10);
	}


	close(sockClient);
}